

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_nonblock.cc
# Opt level: O0

int set_nonblock(int fd)

{
  int iVar1;
  undefined4 local_10;
  int flags;
  int fd_local;
  
  local_10 = fcntl(fd,3,0);
  if (local_10 == 0xffffffff) {
    local_10 = 0;
  }
  iVar1 = fcntl(fd,4,(ulong)(local_10 | 0x800));
  return iVar1;
}

Assistant:

int set_nonblock(int fd)
{
        int flags;
#if defined(O_NONBLOCK)
        if (-1 == (flags = fcntl(fd, F_GETFL, 0)))
                flags = 0;
        return fcntl(fd, F_SETFL, flags | O_NONBLOCK);
#else
        flags = 1;
        return ioctl(fd, FIOBIO, &flags);
#endif
}